

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O3

void conditional_EBNF(Grammar *g)

{
  anon_struct_40_4_d8687ec6_for_rules *v;
  uint uVar1;
  Rule **ppRVar2;
  Production *pPVar3;
  Rule *elem;
  Elem *pEVar4;
  Rule *pRVar5;
  void *elem_00;
  undefined4 *puVar6;
  int iVar7;
  Rule **ppRVar8;
  
  pPVar3 = new_internal_production(g,g->p);
  pPVar3->field_0x3c = pPVar3->field_0x3c & 0xe3 | 8;
  elem = (Rule *)calloc(1,0xa8);
  elem->prod = pPVar3;
  pEVar4 = (Elem *)calloc(1,0x20);
  elem->end = pEVar4;
  pEVar4->kind = ELEM_END;
  pEVar4->rule = elem;
  elem->action_index = g->action_index;
  pRVar5 = g->r;
  pEVar4 = (pRVar5->elems).v[(pRVar5->elems).n - 1];
  (elem->elems).v = (elem->elems).e;
  (elem->elems).n = 1;
  (elem->elems).e[0] = pEVar4;
  (pRVar5->elems).v[(pRVar5->elems).n - 1]->rule = elem;
  (elem->elems).e[0]->rule = elem;
  v = &pPVar3->rules;
  ppRVar2 = (pPVar3->rules).v;
  ppRVar8 = (pPVar3->rules).e;
  if (ppRVar2 == (Rule **)0x0) {
    (pPVar3->rules).v = ppRVar8;
    uVar1 = (pPVar3->rules).n;
    (pPVar3->rules).n = uVar1 + 1;
    (pPVar3->rules).e[uVar1] = elem;
  }
  else {
    uVar1 = v->n;
    if (ppRVar2 == ppRVar8) {
      if (2 < uVar1) goto LAB_001397d6;
    }
    else if ((uVar1 & 7) == 0) {
LAB_001397d6:
      vec_add_internal(v,elem);
      goto LAB_001397e1;
    }
    v->n = uVar1 + 1;
    ppRVar2[uVar1] = elem;
  }
LAB_001397e1:
  ppRVar2 = (pPVar3->rules).v;
  if (ppRVar2 == (Rule **)0x0) {
    pRVar5 = (Rule *)calloc(1,0xa8);
    pRVar5->prod = pPVar3;
    pEVar4 = (Elem *)calloc(1,0x20);
    pRVar5->end = pEVar4;
    pEVar4->kind = ELEM_END;
    pEVar4->rule = pRVar5;
    pRVar5->action_index = g->action_index;
    (pPVar3->rules).v = ppRVar8;
    uVar1 = (pPVar3->rules).n;
    (pPVar3->rules).n = uVar1 + 1;
    (pPVar3->rules).e[uVar1] = pRVar5;
    goto LAB_0013993b;
  }
  uVar1 = (pPVar3->rules).n;
  if (ppRVar2 == ppRVar8) {
    iVar7 = g->action_index;
    if (2 < uVar1) goto LAB_001398f4;
    pRVar5 = (Rule *)calloc(1,0xa8);
    pRVar5->prod = pPVar3;
    pEVar4 = (Elem *)calloc(1,0x20);
    pRVar5->end = pEVar4;
    pEVar4->kind = ELEM_END;
    pEVar4->rule = pRVar5;
    pRVar5->action_index = iVar7;
  }
  else {
    iVar7 = g->action_index;
    if ((uVar1 & 7) == 0) {
LAB_001398f4:
      elem_00 = calloc(1,0xa8);
      *(Production **)((long)elem_00 + 8) = pPVar3;
      puVar6 = (undefined4 *)calloc(1,0x20);
      *(undefined4 **)((long)elem_00 + 0x48) = puVar6;
      *puVar6 = 3;
      *(void **)(puVar6 + 2) = elem_00;
      *(int *)((long)elem_00 + 0x98) = iVar7;
      vec_add_internal(v,elem_00);
      goto LAB_0013993b;
    }
    pRVar5 = (Rule *)calloc(1,0xa8);
    pRVar5->prod = pPVar3;
    pEVar4 = (Elem *)calloc(1,0x20);
    pRVar5->end = pEVar4;
    pEVar4->kind = ELEM_END;
    pEVar4->rule = pRVar5;
    pRVar5->action_index = iVar7;
  }
  (pPVar3->rules).n = uVar1 + 1;
  ppRVar2[uVar1] = pRVar5;
LAB_0013993b:
  pRVar5 = g->r;
  pEVar4 = (Elem *)calloc(1,0x20);
  (pEVar4->e).nterm = pPVar3;
  pEVar4->rule = pRVar5;
  (pRVar5->elems).v[(pRVar5->elems).n - 1] = pEVar4;
  return;
}

Assistant:

void conditional_EBNF(Grammar *g) {
  Production *pp;
  Rule *rr;

  pp = new_internal_production(g, g->p);
  pp->internal = INTERNAL_CONDITIONAL;
  rr = new_rule(g, pp);
  vec_add(&rr->elems, last_elem(g->r));
  last_elem(g->r)->rule = rr;
  rr->elems.v[rr->elems.n - 1]->rule = rr;
  vec_add(&pp->rules, rr);
  vec_add(&pp->rules, new_rule(g, pp));
  last_elem(g->r) = new_elem_nterm(pp, g->r);
}